

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O3

int LZ4_compress_destSize_generic
              (void *ctx,char *src,char *dst,int *srcSizePtr,int targetDstSize,tableType_t tableType
              )

{
  uint uVar1;
  int iVar2;
  char cVar3;
  uint uVar4;
  char *pcVar5;
  long *plVar6;
  byte bVar7;
  byte bVar8;
  char *pcVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  U16 *hashTable;
  ulong uVar13;
  char cVar14;
  long *plVar15;
  long lVar16;
  uint uVar17;
  long *plVar18;
  long *plVar19;
  char *__s;
  int iVar20;
  char *pcVar21;
  ulong uVar22;
  int *piVar23;
  BYTE *s;
  long *__src;
  BYTE *e;
  int *piVar24;
  uint uVar25;
  U16 *hashTable_6;
  
  uVar1 = *srcSizePtr;
  iVar20 = 0;
  if ((uVar1 < 0x7e000001 && 0 < targetDstSize) &&
     (iVar20 = 0, tableType != byU16 || uVar1 < 0x1000b)) {
    pcVar21 = dst + targetDstSize;
    __s = dst;
    __src = (long *)src;
    if (0xc < uVar1) {
      *srcSizePtr = 0;
      bVar7 = tableType == byU16 | 0xc;
      bVar8 = 0x28 - bVar7;
      uVar25 = ~(-1 << bVar7);
      uVar13 = (ulong)((uint)((ulong)(*(long *)src * 0xcf1bbcdcbb) >> (bVar8 & 0x3f)) & uVar25);
      if (tableType == byU16) {
        *(undefined2 *)((long)ctx + uVar13 * 2) = 0;
      }
      else {
        *(undefined4 *)((long)ctx + uVar13 * 4) = 0;
      }
      if (uVar1 != 0xd) {
        plVar6 = (long *)(src + (long)(int)uVar1 + -0xc);
        plVar18 = (long *)(src + 2);
LAB_0015892c:
        lVar11 = *(long *)((long)__src + 1);
        uVar12 = 1;
        plVar15 = (long *)((long)__src + 1);
        uVar4 = 0x41;
        do {
          uVar13 = (ulong)((uint)((ulong)(lVar11 * 0xcf1bbcdcbb) >> (bVar8 & 0x3f)) & uVar25);
          lVar11 = *plVar18;
          if (tableType == byU32) {
            piVar24 = (int *)(src + *(uint *)((long)ctx + uVar13 * 4));
LAB_00158984:
            *(int *)((long)ctx + uVar13 * 4) = (int)((long)plVar15 - (long)src);
            if (plVar15 <= (long *)((long)piVar24 + 0xffffU)) goto LAB_00158994;
          }
          else {
            piVar24 = (int *)(src + *(ushort *)((long)ctx + uVar13 * 2));
            if (tableType != byU16) goto LAB_00158984;
            *(short *)((long)ctx + uVar13 * 2) = (short)((long)plVar15 - (long)src);
LAB_00158994:
            if (*piVar24 == (int)*plVar15) goto LAB_001589c1;
          }
          plVar19 = (long *)((ulong)uVar12 + (long)plVar18);
          uVar12 = uVar4 >> 6;
          plVar15 = plVar18;
          plVar18 = plVar19;
          uVar4 = uVar4 + 1;
          if (plVar6 < plVar19) break;
        } while( true );
      }
    }
LAB_00158750:
    pcVar9 = src + ((long)(int)uVar1 - (long)__src);
    if (pcVar21 < __s + (long)(pcVar9 + (ulong)(pcVar9 + 0xf0) / 0xff + 1)) {
      pcVar9 = pcVar21 + (~(ulong)__s - (ulong)(pcVar21 + ~(ulong)__s + 0xf0) / 0xff);
    }
    pcVar21 = __s + 1;
    if (pcVar9 < (char *)0xf) {
      *__s = (char)pcVar9 << 4;
    }
    else {
      pcVar5 = pcVar9 + -0xf;
      *__s = -0x10;
      if ((char *)0xfe < pcVar5) {
        uVar13 = (ulong)(pcVar9 + -0x10e) / 0xff;
        memset(pcVar21,0xff,uVar13 + 1);
        pcVar21 = __s + uVar13 + 2;
        pcVar5 = pcVar9 + uVar13 * -0xff + -0x10e;
      }
      *pcVar21 = (char)pcVar5;
      pcVar21 = pcVar21 + 1;
    }
    memcpy(pcVar21,__src,(size_t)pcVar9);
    *srcSizePtr = ((int)pcVar9 + (int)__src) - (int)src;
    iVar20 = ((int)pcVar21 + (int)pcVar9) - (int)dst;
  }
  return iVar20;
LAB_001589c1:
  iVar20 = (int)plVar15 - (int)__src;
  uVar12 = iVar20 - 0x10e;
  lVar11 = 0;
  cVar3 = (char)plVar15 * '\x10' + (char)__src * -0x10;
  uVar4 = uVar12;
  do {
    uVar17 = uVar4;
    cVar14 = cVar3;
    lVar16 = lVar11;
    piVar23 = (int *)((long)piVar24 + lVar16);
    plVar18 = (long *)((long)plVar15 + lVar16);
    if ((piVar23 <= src) || (plVar18 <= __src)) break;
    lVar11 = lVar16 + -1;
    cVar3 = cVar14 + -0x10;
    uVar4 = uVar17 - 1;
  } while (*(char *)((long)plVar15 + lVar16 + -1) == *(char *)((long)piVar24 + lVar16 + -1));
  iVar2 = (int)lVar16;
  uVar13 = (ulong)(uint)(iVar2 + ((int)plVar15 - (int)__src));
  if (dst + (long)targetDstSize + -0xb < __s + uVar13 + (ulong)(iVar20 + iVar2 + 0xf0) / 0xff + 1)
  goto LAB_00158750;
  plVar15 = (long *)(__s + 1);
  if ((uint)(iVar20 + iVar2) < 0xf) {
    *__s = cVar14;
  }
  else {
    uVar10 = (ulong)(iVar20 - 0xf) + lVar16;
    *__s = -0x10;
    if (0xfe < (uint)uVar10) {
      memset(plVar15,0xff,(ulong)((iVar2 + uVar12) / 0xff + 1));
      plVar15 = (long *)(__s + ((ulong)uVar12 + lVar16 & 0xffffffff) / 0xff + 2);
      uVar10 = (ulong)(uVar17 / 0xff + iVar2 + uVar12);
    }
    *(char *)plVar15 = (char)uVar10;
    plVar15 = (long *)((long)plVar15 + 1);
  }
  plVar19 = (long *)(uVar13 + (long)plVar15);
  do {
    *plVar15 = *__src;
    plVar15 = plVar15 + 1;
    __src = __src + 1;
    pcVar9 = __s;
  } while (plVar15 < plVar19);
  while( true ) {
    *(short *)plVar19 = (short)plVar18 - (short)piVar23;
    __s = (char *)((long)plVar19 + 2);
    uVar4 = LZ4_count((BYTE *)((long)plVar18 + 4),(BYTE *)(piVar23 + 1),
                      (BYTE *)(src + (long)(int)uVar1 + -5));
    uVar13 = ((long)(dst + (long)targetDstSize + -6) - (long)__s) * 0xff + 0xe;
    if ((char *)((long)plVar19 + ((ulong)uVar4 + 0xf0) / 0xff + 2) <= dst + (long)targetDstSize + -6
       ) {
      uVar13 = (ulong)uVar4;
    }
    if (uVar13 < 0xf) {
      *pcVar9 = *pcVar9 + (char)uVar13;
    }
    else {
      *pcVar9 = *pcVar9 + '\x0f';
      uVar10 = uVar13 - 0xf;
      if (0xfe < uVar10) {
        uVar10 = (uVar13 - 0x10e) / 0xff;
        memset(__s,0xff,uVar10 + 1);
        __s = (char *)((long)plVar19 + uVar10 + 3);
        uVar10 = (uVar13 + uVar10 * -0xff) - 0x10e;
      }
      *__s = (char)uVar10;
      __s = __s + 1;
    }
    __src = (long *)((long)plVar18 + uVar13 + 4);
    if ((plVar6 < __src) || (dst + (long)targetDstSize + -0xc < __s)) goto LAB_00158750;
    uVar10 = (ulong)((uint)((ulong)(*(long *)((long)plVar18 + uVar13 + 2) * 0xcf1bbcdcbb) >>
                           (bVar8 & 0x3f)) & uVar25);
    lVar11 = (long)plVar18 + ((uVar13 + 2) - (long)src);
    if (tableType == byU16) {
      *(short *)((long)ctx + uVar10 * 2) = (short)lVar11;
      uVar10 = (ulong)((uint)((ulong)(*__src * 0xcf1bbcdcbb) >> (bVar8 & 0x3f)) & uVar25);
      uVar22 = (ulong)*(ushort *)((long)ctx + uVar10 * 2);
      *(short *)((long)ctx + uVar10 * 2) = (short)__src - (short)src;
    }
    else {
      *(int *)((long)ctx + uVar10 * 4) = (int)lVar11;
      uVar10 = (ulong)((uint)((ulong)(*__src * 0xcf1bbcdcbb) >> (bVar8 & 0x3f)) & uVar25);
      if (tableType == byU32) {
        uVar22 = (ulong)*(uint *)((long)ctx + uVar10 * 4);
      }
      else {
        uVar22 = (ulong)*(ushort *)((long)ctx + uVar10 * 2);
      }
      *(int *)((long)ctx + uVar10 * 4) = (int)__src - (int)src;
    }
    if ((src + uVar22 + 0xffff < __src) ||
       (piVar23 = (int *)(src + uVar22), *piVar23 != (int)*__src)) break;
    plVar19 = (long *)(__s + 1);
    *__s = '\0';
    plVar18 = __src;
    pcVar9 = __s;
  }
  plVar18 = (long *)((long)plVar18 + uVar13 + 6);
  if (plVar6 < plVar18) goto LAB_00158750;
  goto LAB_0015892c;
}

Assistant:

static int LZ4_compress_destSize_generic(
                       void* const ctx,
                 const char* const src,
                       char* const dst,
                       int*  const srcSizePtr,
                 const int targetDstSize,
                 const tableType_t tableType)
{
    const BYTE* ip = (const BYTE*) src;
    const BYTE* base = (const BYTE*) src;
    const BYTE* lowLimit = (const BYTE*) src;
    const BYTE* anchor = ip;
    const BYTE* const iend = ip + *srcSizePtr;
    const BYTE* const mflimit = iend - MFLIMIT;
    const BYTE* const matchlimit = iend - LASTLITERALS;

    BYTE* op = (BYTE*) dst;
    BYTE* const oend = op + targetDstSize;
    BYTE* const oMaxLit = op + targetDstSize - 2 /* offset */ - 8 /* because 8+MINMATCH==MFLIMIT */ - 1 /* token */;
    BYTE* const oMaxMatch = op + targetDstSize - (LASTLITERALS + 1 /* token */);
    BYTE* const oMaxSeq = oMaxLit - 1 /* token */;

    U32 forwardH;


    /* Init conditions */
    if (targetDstSize < 1) return 0;                                     /* Impossible to store anything */
    if ((U32)*srcSizePtr > (U32)LZ4_MAX_INPUT_SIZE) return 0;            /* Unsupported input size, too large (or negative) */
    if ((tableType == byU16) && (*srcSizePtr>=LZ4_64Klimit)) return 0;   /* Size too large (not within 64K limit) */
    if (*srcSizePtr<LZ4_minLength) goto _last_literals;                  /* Input too small, no compression (all literals) */

    /* First Byte */
    *srcSizePtr = 0;
    LZ4_putPosition(ip, ctx, tableType, base);
    ip++; forwardH = LZ4_hashPosition(ip, tableType);

    /* Main Loop */
    for ( ; ; )
    {
        const BYTE* match;
        BYTE* token;
        {
            const BYTE* forwardIp = ip;
            unsigned step = 1;
            unsigned searchMatchNb = 1 << LZ4_skipTrigger;

            /* Find a match */
            do {
                U32 h = forwardH;
                ip = forwardIp;
                forwardIp += step;
                step = (searchMatchNb++ >> LZ4_skipTrigger);

                if (unlikely(forwardIp > mflimit))
                    goto _last_literals;

                match = LZ4_getPositionOnHash(h, ctx, tableType, base);
                forwardH = LZ4_hashPosition(forwardIp, tableType);
                LZ4_putPositionOnHash(ip, h, ctx, tableType, base);

            } while ( ((tableType==byU16) ? 0 : (match + MAX_DISTANCE < ip))
                || (LZ4_read32(match) != LZ4_read32(ip)) );
        }

        /* Catch up */
        while ((ip>anchor) && (match > lowLimit) && (unlikely(ip[-1]==match[-1]))) { ip--; match--; }

        {
            /* Encode Literal length */
            unsigned litLength = (unsigned)(ip - anchor);
            token = op++;
            if (op + ((litLength+240)/255) + litLength > oMaxLit)
            {
                /* Not enough space for a last match */
                op--;
                goto _last_literals;
            }
            if (litLength>=RUN_MASK)
            {
                unsigned len = litLength - RUN_MASK;
                *token=(RUN_MASK<<ML_BITS);
                for(; len >= 255 ; len-=255) *op++ = 255;
                *op++ = (BYTE)len;
            }
            else *token = (BYTE)(litLength<<ML_BITS);

            /* Copy Literals */
            LZ4_wildCopy(op, anchor, op+litLength);
            op += litLength;
        }

_next_match:
        /* Encode Offset */
        LZ4_writeLE16(op, (U16)(ip-match)); op+=2;

        /* Encode MatchLength */
        {
            size_t matchLength;

            matchLength = LZ4_count(ip+MINMATCH, match+MINMATCH, matchlimit);

            if (op + ((matchLength+240)/255) > oMaxMatch)
            {
                /* Match description too long : reduce it */
                matchLength = (15-1) + (oMaxMatch-op) * 255;
            }
            //printf("offset %5i, matchLength%5i \n", (int)(ip-match), matchLength + MINMATCH);
            ip += MINMATCH + matchLength;

            if (matchLength>=ML_MASK)
            {
                *token += ML_MASK;
                matchLength -= ML_MASK;
                while (matchLength >= 255) { matchLength-=255; *op++ = 255; }
                *op++ = (BYTE)matchLength;
            }
            else *token += (BYTE)(matchLength);
        }

        anchor = ip;

        /* Test end of block */
        if (ip > mflimit) break;
        if (op > oMaxSeq) break;

        /* Fill table */
        LZ4_putPosition(ip-2, ctx, tableType, base);

        /* Test next position */
        match = LZ4_getPosition(ip, ctx, tableType, base);
        LZ4_putPosition(ip, ctx, tableType, base);
        if ( (match+MAX_DISTANCE>=ip)
            && (LZ4_read32(match)==LZ4_read32(ip)) )
        { token=op++; *token=0; goto _next_match; }

        /* Prepare next loop */
        forwardH = LZ4_hashPosition(++ip, tableType);
    }

_last_literals:
    /* Encode Last Literals */
    {
        size_t lastRunSize = (size_t)(iend - anchor);
        if (op + 1 /* token */ + ((lastRunSize+240)/255) /* litLength */ + lastRunSize /* literals */ > oend)
        {
            /* adapt lastRunSize to fill 'dst' */
            lastRunSize  = (oend-op) - 1;
            lastRunSize -= (lastRunSize+240)/255;
        }
        ip = anchor + lastRunSize;

        if (lastRunSize >= RUN_MASK)
        {
            size_t accumulator = lastRunSize - RUN_MASK;
            *op++ = RUN_MASK << ML_BITS;
            for(; accumulator >= 255 ; accumulator-=255) *op++ = 255;
            *op++ = (BYTE) accumulator;
        }
        else
        {
            *op++ = (BYTE)(lastRunSize<<ML_BITS);
        }
        memcpy(op, anchor, lastRunSize);
        op += lastRunSize;
    }

    /* End */
    *srcSizePtr = (int) (((const char*)ip)-src);
    return (int) (((char*)op)-dst);
}